

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RsIfElseSyntax::setChild(RsIfElseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  RsElseClauseSyntax *local_178;
  RsProdItemSyntax *local_170;
  ExpressionSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RsProdItemSyntax *local_68;
  RsProdItemSyntax *local_60;
  undefined8 local_58;
  Info *local_50;
  ExpressionSyntax *local_48;
  ExpressionSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  RsIfElseSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->keyword).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->openParen).kind = (undefined2)local_38;
    (this->openParen).field_0x2 = local_38._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openParen).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->openParen).info = local_30;
    break;
  case 2:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_168 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_48 = local_168;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_40,&local_48);
    (this->condition).ptr = local_40;
    break;
  case 3:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar2._0_8_;
    (this->closeParen).kind = (undefined2)local_58;
    (this->closeParen).field_0x2 = local_58._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->closeParen).rawLen = local_58._4_4_;
    local_50 = TVar2.info;
    (this->closeParen).info = local_50;
    break;
  case 4:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_170 = (RsProdItemSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_170 = SyntaxNode::as<slang::syntax::RsProdItemSyntax>(pSVar1);
    }
    local_68 = local_170;
    not_null<slang::syntax::RsProdItemSyntax*>::not_null<slang::syntax::RsProdItemSyntax*,void>
              ((not_null<slang::syntax::RsProdItemSyntax*> *)&local_60,&local_68);
    (this->ifItem).ptr = local_60;
    break;
  case 5:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_178 = (RsElseClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::RsElseClauseSyntax>(pSVar1);
    }
    this->elseClause = local_178;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x2c3f);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void RsIfElseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: condition = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: ifItem = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        case 5: elseClause = child.node() ? &child.node()->as<RsElseClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}